

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cpio.c
# Opt level: O0

int64_t atol16(char *p,uint char_cnt)

{
  int local_2c;
  ulong uStack_28;
  int digit;
  int64_t l;
  char *pcStack_18;
  uint char_cnt_local;
  char *p_local;
  
  uStack_28 = 0;
  l._4_4_ = char_cnt;
  pcStack_18 = p;
  do {
    if (l._4_4_ == 0) {
      return uStack_28;
    }
    if ((*pcStack_18 < 'a') || ('f' < *pcStack_18)) {
      if ((*pcStack_18 < 'A') || ('F' < *pcStack_18)) {
        if (*pcStack_18 < '0') {
          return uStack_28;
        }
        if ('9' < *pcStack_18) {
          return uStack_28;
        }
        local_2c = *pcStack_18 + -0x30;
      }
      else {
        local_2c = *pcStack_18 + -0x37;
      }
    }
    else {
      local_2c = *pcStack_18 + -0x57;
    }
    pcStack_18 = pcStack_18 + 1;
    uStack_28 = (long)local_2c | uStack_28 << 4;
    l._4_4_ = l._4_4_ - 1;
  } while( true );
}

Assistant:

static int64_t
atol16(const char *p, unsigned char_cnt)
{
	int64_t l;
	int digit;

	l = 0;
	while (char_cnt-- > 0) {
		if (*p >= 'a' && *p <= 'f')
			digit = *p - 'a' + 10;
		else if (*p >= 'A' && *p <= 'F')
			digit = *p - 'A' + 10;
		else if (*p >= '0' && *p <= '9')
			digit = *p - '0';
		else
			return (l);
		p++;
		l <<= 4;
		l |= digit;
	}
	return (l);
}